

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O2

Am_Text_Style_Run * __thiscall
Am_Rich_Text_Data::Get_Style_Run_At
          (Am_Rich_Text_Data *this,Am_Text_Index inIndex,Am_Text_Length *outRemChars)

{
  Am_Text_Style_Run *pAVar1;
  ulong uVar2;
  ulong uVar3;
  
  pAVar1 = this->mHeadStyle;
  *outRemChars = 0;
  uVar2 = 0;
  while( true ) {
    if (pAVar1 == (Am_Text_Style_Run *)0x0) {
      return (Am_Text_Style_Run *)0x0;
    }
    uVar3 = pAVar1->mCharsInRun + uVar2;
    if (inIndex <= uVar3) break;
    pAVar1 = pAVar1->mNext;
    uVar2 = uVar3;
  }
  *outRemChars = inIndex - uVar2;
  return pAVar1;
}

Assistant:

Am_Text_Style_Run *
Am_Rich_Text_Data::Get_Style_Run_At(const Am_Text_Index inIndex,
                                    Am_Text_Length &outRemChars) const
{
  Am_Text_Index lastCharInRun = 0;
  Am_Text_Style_Run *sr = mHeadStyle;
  outRemChars = 0; // just in case

  while (sr != nullptr) {
    lastCharInRun += sr->Length();
    if (inIndex <= lastCharInRun) {
      // find the relative index
      outRemChars = sr->Length() - lastCharInRun + inIndex;
      break;
    }
    sr = sr->Next();
  }
  return sr;
}